

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa_util.cpp
# Opt level: O0

Instruction * spvtools::opt::anon_unknown_0::GetVariableType(IRContext *context,Instruction *var)

{
  Op OVar1;
  uint32_t uVar2;
  DefUseManager *pDVar3;
  Instruction *this;
  uint32_t var_type_id;
  Instruction *ptr_type_inst;
  uint32_t ptr_type_id;
  Instruction *var_local;
  IRContext *context_local;
  
  OVar1 = opt::Instruction::opcode(var);
  if (OVar1 == OpVariable) {
    uVar2 = opt::Instruction::type_id(var);
    pDVar3 = IRContext::get_def_use_mgr(context);
    this = analysis::DefUseManager::GetDef(pDVar3,uVar2);
    OVar1 = opt::Instruction::opcode(this);
    if (OVar1 == OpTypePointer) {
      uVar2 = opt::Instruction::GetSingleWordInOperand(this,1);
      pDVar3 = IRContext::get_def_use_mgr(context);
      context_local = (IRContext *)analysis::DefUseManager::GetDef(pDVar3,uVar2);
    }
    else {
      context_local = (IRContext *)0x0;
    }
  }
  else {
    context_local = (IRContext *)0x0;
  }
  return (Instruction *)context_local;
}

Assistant:

Instruction* GetVariableType(IRContext* context, Instruction* var) {
  if (var->opcode() != spv::Op::OpVariable) {
    return nullptr;
  }

  uint32_t ptr_type_id = var->type_id();
  Instruction* ptr_type_inst = context->get_def_use_mgr()->GetDef(ptr_type_id);
  if (ptr_type_inst->opcode() != spv::Op::OpTypePointer) {
    return nullptr;
  }

  uint32_t var_type_id = ptr_type_inst->GetSingleWordInOperand(1);
  return context->get_def_use_mgr()->GetDef(var_type_id);
}